

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O3

void Ivy_NodeSimulate(Ivy_FraigMan_t *p,Ivy_Obj_t *pObj)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  Ivy_Obj_t *pIVar3;
  Ivy_Obj_t *pIVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFraig.c"
                  ,0x37c,"void Ivy_NodeSimulate(Ivy_FraigMan_t *, Ivy_Obj_t *)");
  }
  pIVar2 = pObj->pFanin0;
  pIVar3 = pObj->pFanin1;
  if (((ulong)pIVar2 & 1) == 0) {
    uVar9 = *(uint *)&pIVar2->field_0x8 >> 7 & 1;
  }
  else {
    uVar9 = (uint)((*(byte *)(((ulong)pIVar2 & 0xfffffffffffffffe) + 8) & 0x80) == 0);
  }
  if (((ulong)pIVar3 & 1) == 0) {
    uVar10 = *(uint *)&pIVar3->field_0x8 >> 7 & 1;
  }
  else {
    uVar10 = (uint)((*(byte *)(((ulong)pIVar3 & 0xfffffffffffffffe) + 8) & 0x80) == 0);
  }
  pIVar4 = pObj->pFanout;
  lVar5 = *(long *)(((ulong)pIVar2 & 0xfffffffffffffffe) + 0x20);
  lVar6 = *(long *)(((ulong)pIVar3 & 0xfffffffffffffffe) + 0x20);
  uVar8 = *(uint *)&pObj->field_0x8 >> 7;
  if ((uVar9 == 0) || (uVar10 == 0)) {
    if ((uVar9 == 0) || (uVar10 != 0)) {
      iVar1 = p->nSimWords;
      if ((uVar9 == 0) && (uVar10 != 0)) {
        if ((uVar8 & 1) == 0) {
          if (0 < iVar1) {
            lVar7 = 0;
            do {
              *(uint *)((long)&pIVar4->pFanout + lVar7 * 4) =
                   ~*(uint *)(lVar6 + 0x20 + lVar7 * 4) & *(uint *)(lVar5 + 0x20 + lVar7 * 4);
              lVar7 = lVar7 + 1;
            } while (lVar7 < p->nSimWords);
          }
        }
        else if (0 < iVar1) {
          lVar7 = 0;
          do {
            *(uint *)((long)&pIVar4->pFanout + lVar7 * 4) =
                 ~*(uint *)(lVar5 + 0x20 + lVar7 * 4) | *(uint *)(lVar6 + 0x20 + lVar7 * 4);
            lVar7 = lVar7 + 1;
          } while (lVar7 < p->nSimWords);
        }
      }
      else if ((uVar8 & 1) == 0) {
        if (0 < iVar1) {
          lVar7 = 0;
          do {
            *(uint *)((long)&pIVar4->pFanout + lVar7 * 4) =
                 *(uint *)(lVar6 + 0x20 + lVar7 * 4) & *(uint *)(lVar5 + 0x20 + lVar7 * 4);
            lVar7 = lVar7 + 1;
          } while (lVar7 < p->nSimWords);
        }
      }
      else if (0 < iVar1) {
        lVar7 = 0;
        do {
          *(uint *)((long)&pIVar4->pFanout + lVar7 * 4) =
               ~(*(uint *)(lVar6 + 0x20 + lVar7 * 4) & *(uint *)(lVar5 + 0x20 + lVar7 * 4));
          lVar7 = lVar7 + 1;
        } while (lVar7 < p->nSimWords);
      }
    }
    else if ((uVar8 & 1) == 0) {
      if (0 < p->nSimWords) {
        lVar7 = 0;
        do {
          *(uint *)((long)&pIVar4->pFanout + lVar7 * 4) =
               ~*(uint *)(lVar5 + 0x20 + lVar7 * 4) & *(uint *)(lVar6 + 0x20 + lVar7 * 4);
          lVar7 = lVar7 + 1;
        } while (lVar7 < p->nSimWords);
      }
    }
    else if (0 < p->nSimWords) {
      lVar7 = 0;
      do {
        *(uint *)((long)&pIVar4->pFanout + lVar7 * 4) =
             ~*(uint *)(lVar6 + 0x20 + lVar7 * 4) | *(uint *)(lVar5 + 0x20 + lVar7 * 4);
        lVar7 = lVar7 + 1;
      } while (lVar7 < p->nSimWords);
    }
  }
  else if ((uVar8 & 1) == 0) {
    if (0 < p->nSimWords) {
      lVar7 = 0;
      do {
        *(uint *)((long)&pIVar4->pFanout + lVar7 * 4) =
             ~(*(uint *)(lVar6 + 0x20 + lVar7 * 4) | *(uint *)(lVar5 + 0x20 + lVar7 * 4));
        lVar7 = lVar7 + 1;
      } while (lVar7 < p->nSimWords);
    }
  }
  else if (0 < p->nSimWords) {
    lVar7 = 0;
    do {
      *(uint *)((long)&pIVar4->pFanout + lVar7 * 4) =
           *(uint *)(lVar6 + 0x20 + lVar7 * 4) | *(uint *)(lVar5 + 0x20 + lVar7 * 4);
      lVar7 = lVar7 + 1;
    } while (lVar7 < p->nSimWords);
  }
  return;
}

Assistant:

void Ivy_NodeSimulate( Ivy_FraigMan_t * p, Ivy_Obj_t * pObj )
{
    Ivy_FraigSim_t * pSims, * pSims0, * pSims1;
    int fCompl, fCompl0, fCompl1, i;
    assert( !Ivy_IsComplement(pObj) );
    // get hold of the simulation information
    pSims  = Ivy_ObjSim(pObj);
    pSims0 = Ivy_ObjSim(Ivy_ObjFanin0(pObj));
    pSims1 = Ivy_ObjSim(Ivy_ObjFanin1(pObj));
    // get complemented attributes of the children using their random info
    fCompl  = pObj->fPhase;
    fCompl0 = Ivy_ObjFaninPhase(Ivy_ObjChild0(pObj));
    fCompl1 = Ivy_ObjFaninPhase(Ivy_ObjChild1(pObj));
    // simulate
    if ( fCompl0 && fCompl1 )
    {
        if ( fCompl )
            for ( i = 0; i < p->nSimWords; i++ )
                pSims->pData[i] = (pSims0->pData[i] | pSims1->pData[i]);
        else
            for ( i = 0; i < p->nSimWords; i++ )
                pSims->pData[i] = ~(pSims0->pData[i] | pSims1->pData[i]);
    }
    else if ( fCompl0 && !fCompl1 )
    {
        if ( fCompl )
            for ( i = 0; i < p->nSimWords; i++ )
                pSims->pData[i] = (pSims0->pData[i] | ~pSims1->pData[i]);
        else
            for ( i = 0; i < p->nSimWords; i++ )
                pSims->pData[i] = (~pSims0->pData[i] & pSims1->pData[i]);
    }
    else if ( !fCompl0 && fCompl1 )
    {
        if ( fCompl )
            for ( i = 0; i < p->nSimWords; i++ )
                pSims->pData[i] = (~pSims0->pData[i] | pSims1->pData[i]);
        else
            for ( i = 0; i < p->nSimWords; i++ )
                pSims->pData[i] = (pSims0->pData[i] & ~pSims1->pData[i]);
    }
    else // if ( !fCompl0 && !fCompl1 )
    {
        if ( fCompl )
            for ( i = 0; i < p->nSimWords; i++ )
                pSims->pData[i] = ~(pSims0->pData[i] & pSims1->pData[i]);
        else
            for ( i = 0; i < p->nSimWords; i++ )
                pSims->pData[i] = (pSims0->pData[i] & pSims1->pData[i]);
    }
}